

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faddeeva.c
# Opt level: O0

double xc_erfcx(double x)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double ispi;
  double in_stack_00000268;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_8;
  
  if (in_XMM0_Qa < 0.0) {
    if (-26.7 <= in_XMM0_Qa) {
      if (-6.1 <= in_XMM0_Qa) {
        dVar1 = exp(in_XMM0_Qa * in_XMM0_Qa);
        dVar2 = erfcx_y100(in_stack_00000268);
        local_28 = dVar1 + dVar1 + -dVar2;
      }
      else {
        local_28 = exp(in_XMM0_Qa * in_XMM0_Qa);
        local_28 = local_28 * 2.0;
      }
      local_20 = local_28;
    }
    else {
      local_20 = INFINITY;
    }
    local_8 = local_20;
  }
  else if (in_XMM0_Qa <= 50.0) {
    local_8 = erfcx_y100(in_stack_00000268);
  }
  else if (in_XMM0_Qa <= 50000000.0) {
    local_8 = ((in_XMM0_Qa * in_XMM0_Qa * (in_XMM0_Qa * in_XMM0_Qa + 4.5) + 2.0) *
              0.5641895835477563) /
              (in_XMM0_Qa * (in_XMM0_Qa * in_XMM0_Qa * (in_XMM0_Qa * in_XMM0_Qa + 5.0) + 3.75));
  }
  else {
    local_8 = 0.5641895835477563 / in_XMM0_Qa;
  }
  return local_8;
}

Assistant:

GPU_FUNCTION
double xc_erfcx(double x)
{
  if (x >= 0) {
    if (x > 50) { // continued-fraction expansion is faster
      const double ispi = 0.56418958354775628694807945156; // 1 / sqrt(pi)
      if (x > 5e7) // 1-term expansion, important to avoid overflow
        return ispi / x;
      /* 5-term expansion (rely on compiler for CSE), simplified from:
                ispi / (x+0.5/(x+1/(x+1.5/(x+2/x))))  */
      return ispi*((x*x) * (x*x+4.5) + 2) / (x * ((x*x) * (x*x+5) + 3.75));
    }
    return erfcx_y100(400/(4+x));
  }
  else
    return x < -26.7 ? HUGE_VAL : (x < -6.1 ? 2*exp(x*x)
                                   : 2*exp(x*x) - erfcx_y100(400/(4-x)));
}